

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall PClassPlayerPawn::PClassPlayerPawn(PClassPlayerPawn *this)

{
  size_t i;
  long lVar1;
  undefined1 auVar2 [16];
  
  PClassActor::PClassActor(&this->super_PClassActor);
  *(undefined ***)
   &(this->super_PClassActor).super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType = &PTR_StaticType_006f7d48;
  (this->DisplayName).Chars = FString::NullString.Nothing;
  (this->SoundClass).Chars = FString::NullString.Nothing;
  (this->Face).Chars = FString::NullString.Nothing;
  (this->Portrait).Chars = FString::NullString.Nothing;
  auVar2._8_4_ = 0x71deec;
  auVar2._0_8_ = 0x71deec;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])this->Slot = auVar2;
  *(undefined1 (*) [16])(this->Slot + 2) = auVar2;
  *(undefined1 (*) [16])(this->Slot + 4) = auVar2;
  *(undefined1 (*) [16])(this->Slot + 6) = auVar2;
  *(undefined1 (*) [16])(this->Slot + 8) = auVar2;
  FString::NullString.RefCount = FString::NullString.RefCount + 0xe;
  this->InvulMode = 0;
  this->HealingRadiusType = 0;
  TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::TMap
            (&this->ColorSets);
  TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_>::TMap(&this->PainFlashes);
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    this->HexenArmor[lVar1] = 0.0;
  }
  this->ColorRangeStart = '\0';
  this->ColorRangeEnd = '\0';
  return;
}

Assistant:

PClassPlayerPawn::PClassPlayerPawn()
{
	for (size_t i = 0; i < countof(HexenArmor); ++i)
	{
		HexenArmor[i] = 0;
	}
	ColorRangeStart = 0;
	ColorRangeEnd = 0;
}